

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O2

void __thiscall Assimp::SMDImporter::CreateOutputAnimation(SMDImporter *this,int index,string *name)

{
  double *pdVar1;
  double *pdVar2;
  undefined8 *puVar3;
  double dVar4;
  aiAnimation **ppaVar5;
  aiAnimation *paVar6;
  aiNodeAnim **ppaVar7;
  aiNodeAnim *paVar8;
  ulong uVar9;
  aiVectorKey *paVar10;
  long lVar11;
  aiQuatKey *paVar12;
  aiQuatKey *paVar13;
  ulong uVar14;
  ulong uVar15;
  pointer pMVar16;
  uint uVar17;
  pointer pBVar18;
  double local_40;
  double dStack_38;
  
  paVar6 = (aiAnimation *)operator_new(0x448);
  aiAnimation::aiAnimation(paVar6);
  ppaVar5 = this->pScene->mAnimations;
  ppaVar5[index] = paVar6;
  if (name->_M_string_length != 0) {
    aiString::Set((aiString *)paVar6,(name->_M_dataplus)._M_p);
    paVar6 = ppaVar5[index];
  }
  paVar6->mDuration = this->dLengthOfAnim;
  ppaVar5[index]->mNumChannels =
       (uint)(((long)(this->asBones).
                     super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->asBones).
                    super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>.
                    _M_impl.super__Vector_impl_data._M_start) / 0x90);
  ppaVar5[index]->mTicksPerSecond = 25.0;
  paVar6 = ppaVar5[index];
  ppaVar7 = (aiNodeAnim **)operator_new__((ulong)paVar6->mNumChannels << 3);
  paVar6->mChannels = ppaVar7;
  uVar14 = 0;
  for (pBVar18 = (this->asBones).
                 super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pBVar18 !=
      (this->asBones).super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>.
      _M_impl.super__Vector_impl_data._M_finish; pBVar18 = pBVar18 + 1) {
    paVar8 = (aiNodeAnim *)operator_new(0x438);
    (paVar8->mNodeName).length = 0;
    (paVar8->mNodeName).data[0] = '\0';
    memset((paVar8->mNodeName).data + 1,0x1b,0x3ff);
    paVar8->mRotationKeys = (aiQuatKey *)0x0;
    paVar8->mNumScalingKeys = 0;
    *(undefined8 *)&paVar8->mNumPositionKeys = 0;
    *(undefined8 *)((long)&paVar8->mPositionKeys + 4) = 0;
    paVar8->mScalingKeys = (aiVectorKey *)0x0;
    paVar8->mPreState = aiAnimBehaviour_DEFAULT;
    paVar8->mPostState = aiAnimBehaviour_DEFAULT;
    ppaVar7[uVar14] = paVar8;
    uVar9 = (pBVar18->mName)._M_string_length;
    if (uVar9 < 0x400) {
      (paVar8->mNodeName).length = (ai_uint32)uVar9;
      memcpy((paVar8->mNodeName).data,(pBVar18->mName)._M_dataplus._M_p,uVar9);
      (paVar8->mNodeName).data[uVar9] = '\0';
    }
    uVar9 = ((long)(pBVar18->sAnim).asKeys.
                   super__Vector_base<Assimp::SMD::Bone::Animation::MatrixKey,_std::allocator<Assimp::SMD::Bone::Animation::MatrixKey>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)(pBVar18->sAnim).asKeys.
                  super__Vector_base<Assimp::SMD::Bone::Animation::MatrixKey,_std::allocator<Assimp::SMD::Bone::Animation::MatrixKey>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0xa0;
    uVar17 = (uint)uVar9;
    paVar8->mNumRotationKeys = uVar17;
    if (uVar17 != 0) {
      paVar8->mNumPositionKeys = uVar17;
      uVar15 = (uVar9 & 0xffffffff) * 0x18;
      paVar10 = (aiVectorKey *)operator_new__(uVar15);
      lVar11 = 0;
      do {
        *(undefined4 *)((long)&(paVar10->mValue).z + lVar11) = 0;
        puVar3 = (undefined8 *)((long)&paVar10->mTime + lVar11);
        *puVar3 = 0;
        puVar3[1] = 0;
        lVar11 = lVar11 + 0x18;
      } while (uVar15 - lVar11 != 0);
      paVar8->mPositionKeys = paVar10;
      paVar12 = (aiQuatKey *)operator_new__((uVar9 & 0xffffffff) * 0x18);
      paVar13 = paVar12;
      do {
        paVar13->mTime = 0.0;
        (paVar13->mValue).w = 1.0;
        (paVar13->mValue).x = 0.0;
        (paVar13->mValue).y = 0.0;
        (paVar13->mValue).z = 0.0;
        paVar13 = paVar13 + 1;
      } while (paVar13 != paVar12 + (uVar9 & 0xffffffff));
      paVar8->mRotationKeys = paVar12;
      lVar11 = 0;
      for (pMVar16 = (pBVar18->sAnim).asKeys.
                     super__Vector_base<Assimp::SMD::Bone::Animation::MatrixKey,_std::allocator<Assimp::SMD::Bone::Animation::MatrixKey>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pMVar16 !=
          (pBVar18->sAnim).asKeys.
          super__Vector_base<Assimp::SMD::Bone::Animation::MatrixKey,_std::allocator<Assimp::SMD::Bone::Animation::MatrixKey>_>
          ._M_impl.super__Vector_impl_data._M_finish; pMVar16 = pMVar16 + 1) {
        pdVar1 = (double *)((long)&paVar10->mTime + lVar11);
        pdVar2 = (double *)((long)&paVar12->mTime + lVar11);
        dVar4 = pMVar16->dTime;
        *pdVar1 = dVar4;
        *pdVar2 = dVar4;
        aiQuaterniont<float>::aiQuaterniont
                  ((aiQuaterniont<float> *)&local_40,(pMVar16->vRot).y,(pMVar16->vRot).z,
                   (pMVar16->vRot).x);
        pdVar2[1] = local_40;
        pdVar2[2] = dStack_38;
        *(float *)(pdVar1 + 2) = (pMVar16->vPos).z;
        pdVar1[1] = *(double *)&pMVar16->vPos;
        lVar11 = lVar11 + 0x18;
      }
    }
    uVar14 = (ulong)((int)uVar14 + 1);
  }
  return;
}

Assistant:

void SMDImporter::CreateOutputAnimation(int index, const std::string &name) {
    aiAnimation*& anim = pScene->mAnimations[index] = new aiAnimation();

    if (name.length()) {
        anim->mName.Set(name.c_str());
    }
    anim->mDuration = dLengthOfAnim;
    anim->mNumChannels = static_cast<unsigned int>( asBones.size() );
    anim->mTicksPerSecond = 25.0; // FIXME: is this correct?

    aiNodeAnim** pp = anim->mChannels = new aiNodeAnim*[anim->mNumChannels];

    // now build valid keys
    unsigned int a = 0;
    for (std::vector<SMD::Bone>::const_iterator i = asBones.begin(); i != asBones.end(); ++i) {
        aiNodeAnim* p = pp[a] = new aiNodeAnim();

        // copy the name of the bone
        p->mNodeName.Set(i->mName);

        p->mNumRotationKeys = (unsigned int)(*i).sAnim.asKeys.size();
        if (p->mNumRotationKeys){
            p->mNumPositionKeys = p->mNumRotationKeys;
            aiVectorKey* pVecKeys = p->mPositionKeys = new aiVectorKey[p->mNumRotationKeys];
            aiQuatKey* pRotKeys = p->mRotationKeys = new aiQuatKey[p->mNumRotationKeys];

            for (std::vector<SMD::Bone::Animation::MatrixKey>::const_iterator
                    qq = (*i).sAnim.asKeys.begin();
                    qq != (*i).sAnim.asKeys.end(); ++qq) {
                pRotKeys->mTime = pVecKeys->mTime = (*qq).dTime;

                // compute the rotation quaternion from the euler angles
                // aiQuaternion: The order of the parameters is yzx?
                pRotKeys->mValue = aiQuaternion((*qq).vRot.y, (*qq).vRot.z, (*qq).vRot.x);
                pVecKeys->mValue = (*qq).vPos;

                ++pVecKeys; ++pRotKeys;
            }
        }
        ++a;

        // there are no scaling keys ...
    }
}